

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingExtension
          (MergedDescriptorDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  value_type pDVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppDVar5;
  string *psVar6;
  int local_10c;
  undefined1 local_108 [4];
  int j;
  FileDescriptorProto temp;
  int i;
  FileDescriptorProto *output_local;
  int field_number_local;
  string *containing_type_local;
  MergedDescriptorDatabase *this_local;
  
  temp._has_bits_[0] = 0;
  while( true ) {
    uVar3 = (ulong)(int)temp._has_bits_[0];
    sVar4 = std::
            vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ::size(&this->sources_);
    if (sVar4 <= uVar3) {
      return false;
    }
    ppDVar5 = std::
              vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ::operator[](&this->sources_,(long)(int)temp._has_bits_[0]);
    uVar2 = (*(*ppDVar5)->_vptr_DescriptorDatabase[4])
                      (*ppDVar5,containing_type,(ulong)(uint)field_number,output);
    if ((uVar2 & 1) != 0) break;
    temp._has_bits_[0] = temp._has_bits_[0] + 1;
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108);
  local_10c = 0;
  do {
    if ((int)temp._has_bits_[0] <= local_10c) {
      this_local._7_1_ = true;
LAB_00314289:
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
      return this_local._7_1_;
    }
    ppDVar5 = std::
              vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ::operator[](&this->sources_,(long)local_10c);
    pDVar1 = *ppDVar5;
    psVar6 = FileDescriptorProto::name_abi_cxx11_(output);
    uVar2 = (*pDVar1->_vptr_DescriptorDatabase[2])(pDVar1,psVar6,local_108);
    if ((uVar2 & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_00314289;
    }
    local_10c = local_10c + 1;
  } while( true );
}

Assistant:

bool MergedDescriptorDatabase::FindFileContainingExtension(
    const string& containing_type,
    int field_number,
    FileDescriptorProto* output) {
  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileContainingExtension(
          containing_type, field_number, output)) {
      // The symbol was found in source i.  However, if one of the previous
      // sources defines a file with the same name (which presumably doesn't
      // contain the symbol, since it wasn't found in that source), then we
      // must hide it from the caller.
      FileDescriptorProto temp;
      for (int j = 0; j < i; j++) {
        if (sources_[j]->FindFileByName(output->name(), &temp)) {
          // Found conflicting file in a previous source.
          return false;
        }
      }
      return true;
    }
  }
  return false;
}